

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::TranslatePercussionPresetZone(SFFile *this,SFPreset *preset,SFBag *pzone)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  SFInst *pSVar7;
  SFBag *pSVar8;
  ushort uVar9;
  long lVar10;
  byte bVar11;
  long lVar12;
  uint uVar13;
  SFPreset **ppSVar14;
  SFPerc *pSVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  byte bVar19;
  SFPerc perc;
  SFPreset *local_a0;
  anon_union_2_2_c2a07933_for_SFGenComposite_0 local_98;
  byte local_96;
  byte local_95;
  undefined2 local_94;
  byte local_32;
  
  bVar19 = 0;
  bVar2 = (pzone->KeyRange).Lo;
  bVar11 = (pzone->KeyRange).Hi;
  if (bVar2 <= bVar11) {
    uVar13 = (uint)bVar2;
    do {
      pSVar7 = this->Instruments;
      lVar10 = (long)pzone->Target;
      uVar5 = pSVar7[lVar10].BagIndex;
      uVar17 = (ulong)uVar5;
      uVar9 = pSVar7[lVar10 + 1].BagIndex;
      if (uVar5 < uVar9) {
        lVar16 = (ulong)((uint)uVar5 * 4) * 3;
        do {
          pSVar8 = this->InstrBags;
          iVar6 = *(int *)((long)&pSVar8->Target + lVar16);
          if (((-1 < iVar6) && ((&(pSVar8->KeyRange).Lo)[lVar16] <= uVar13)) &&
             (uVar13 <= (&(pSVar8->KeyRange).Hi)[lVar16])) {
            bVar2 = (&(pSVar8->VelRange).Lo)[lVar16];
            bVar11 = (pzone->VelRange).Hi;
            if (bVar2 <= bVar11) {
              bVar3 = (&(pSVar8->VelRange).Hi)[lVar16];
              bVar4 = (pzone->VelRange).Lo;
              if (bVar4 <= bVar3) {
                local_32 = preset->field_0x15 & 0x7f;
                local_a0 = preset;
                memcpy(&local_98,&DefaultGenerators,0x66);
                if ((char)pSVar7[lVar10].field_0x15 < '\0') {
                  SetInstrumentGenerators
                            (this,(SFGenComposite *)&local_98.keyRange,
                             (uint)pSVar8[pSVar7[lVar10].BagIndex].GenIndex,
                             (uint)pSVar8[(ulong)pSVar7[lVar10].BagIndex + 1].GenIndex);
                }
                SetInstrumentGenerators
                          (this,(SFGenComposite *)&local_98.keyRange,
                           (uint)*(ushort *)((long)&pSVar8->GenIndex + lVar16),
                           (uint)*(ushort *)((long)&pSVar8[1].GenIndex + lVar16));
                AddPresetGenerators(this,(SFGenComposite *)&local_98.keyRange,(uint)pzone->GenIndex,
                                    (uint)pzone[1].GenIndex,preset);
                local_98.keyRange.Lo = (BYTE)preset->Program;
                local_98.keyRange.Hi = (BYTE)uVar13;
                local_96 = bVar2;
                if (bVar2 < bVar4) {
                  local_96 = bVar4;
                }
                local_95 = bVar3;
                if (bVar11 < bVar3) {
                  local_95 = bVar11;
                }
                local_94 = (undefined2)iVar6;
                TArray<SFPerc,_SFPerc>::Grow(&this->Percussion,1);
                ppSVar14 = &local_a0;
                pSVar15 = (this->Percussion).Array + (this->Percussion).Count;
                for (lVar12 = 0xe; lVar12 != 0; lVar12 = lVar12 + -1) {
                  pSVar15->Preset = *ppSVar14;
                  ppSVar14 = ppSVar14 + (ulong)bVar19 * -2 + 1;
                  pSVar15 = (SFPerc *)((long)pSVar15 + ((ulong)bVar19 * -2 + 1) * 8);
                }
                puVar1 = &(this->Percussion).Count;
                *puVar1 = *puVar1 + 1;
                uVar9 = pSVar7[lVar10 + 1].BagIndex;
              }
            }
          }
          uVar17 = uVar17 + 1;
          lVar16 = lVar16 + 0xc;
        } while (uVar17 < uVar9);
        bVar11 = (pzone->KeyRange).Hi;
      }
      bVar18 = uVar13 < bVar11;
      uVar13 = uVar13 + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

void SFFile::TranslatePercussionPresetZone(SFPreset *preset, SFBag *pzone)
{
	int key, i;

	for (key = pzone->KeyRange.Lo; key <= pzone->KeyRange.Hi; ++key)
	{
		SFInst *inst = &Instruments[pzone->Target];
		for (i = inst->BagIndex; i < (inst + 1)->BagIndex; ++i)
		{
			if (InstrBags[i].Target < 0)
			{ // This instrument zone has no sample.
				continue;
			}
			if (InstrBags[i].KeyRange.Lo > key || InstrBags[i].KeyRange.Hi < key)
			{ // This instrument zone does not contain the key we want.
				continue;
			}
			if (InstrBags[i].VelRange.Lo > pzone->VelRange.Hi ||
				InstrBags[i].VelRange.Hi < pzone->VelRange.Lo)
			{ // This instrument zone does not intersect the current velocity range.
				continue;
			}
			// An intersection! Add the composite generator for this key and velocity range.
			SFPerc perc;
			perc.LoadOrder = preset->LoadOrder;
			perc.Preset = preset;
			perc.Generators = DefaultGenerators;
			if (inst->bHasGlobalZone)
			{
				SetInstrumentGenerators(&perc.Generators, InstrBags[inst->BagIndex].GenIndex, InstrBags[inst->BagIndex + 1].GenIndex);
			}
			SetInstrumentGenerators(&perc.Generators, InstrBags[i].GenIndex, InstrBags[i + 1].GenIndex);
			AddPresetGenerators(&perc.Generators, pzone->GenIndex, (pzone + 1)->GenIndex, preset);
			perc.Generators.drumset = (BYTE)preset->Program;
			perc.Generators.key = key;
			perc.Generators.velRange.Lo = MAX(pzone->VelRange.Lo, InstrBags[i].VelRange.Lo);
			perc.Generators.velRange.Hi = MIN(pzone->VelRange.Hi, InstrBags[i].VelRange.Hi);
			perc.Generators.sampleID = InstrBags[i].Target;
			Percussion.Push(perc);
		}
	}
}